

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_edge_cases(void)

{
  int iVar1;
  size_t outlen;
  uchar seckey [32];
  uchar privkey [300];
  unsigned_long _zzq_result_7;
  unsigned_long _zzq_args_7 [6];
  unsigned_long _zzq_result_6;
  unsigned_long _zzq_args_6 [6];
  unsigned_long _zzq_result_5;
  unsigned_long _zzq_args_5 [6];
  unsigned_long _zzq_result_4;
  unsigned_long _zzq_args_4 [6];
  unsigned_long _zzq_result_3;
  unsigned_long _zzq_args_3 [6];
  unsigned_long _zzq_result_2;
  unsigned_long _zzq_args_2 [6];
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  uchar nonce4 [32];
  uchar nonce3 [32];
  uchar nonce2_1 [32];
  uchar nonce_1 [32];
  uchar zeros [32];
  int j_1;
  int j;
  uchar *extra;
  secp256k1_scalar ss_6;
  secp256k1_scalar sr_6 [512];
  secp256k1_ecdsa_signature sig2;
  uchar msg_7 [32];
  uchar key_7 [32];
  int i;
  uchar msg_6 [32];
  uchar key_6 [32];
  uchar signature [72];
  int32_t ecount;
  size_t siglen;
  secp256k1_pubkey pubkey_4;
  secp256k1_scalar ss_5;
  secp256k1_scalar sr_5;
  secp256k1_scalar msg_5;
  secp256k1_ge key_5;
  uchar csr_1 [32];
  uchar pubkey_3 [33];
  secp256k1_scalar ss_4;
  secp256k1_scalar sr_4;
  secp256k1_scalar msg_4;
  secp256k1_ge key2_1;
  secp256k1_ge key_4;
  uchar csr [32];
  uchar pubkey2_1 [33];
  uchar pubkey_2 [33];
  secp256k1_scalar ss_3;
  secp256k1_scalar sr_3;
  secp256k1_scalar msg_3;
  secp256k1_ge key2;
  secp256k1_ge key_3;
  uchar pubkey2 [33];
  uchar pubkey_1 [33];
  secp256k1_scalar ss_2;
  secp256k1_scalar sr_2;
  secp256k1_scalar msg_2;
  secp256k1_ge key_2;
  uchar pubkey [33];
  secp256k1_scalar ss_1;
  secp256k1_scalar sr_1;
  secp256k1_scalar msg_1;
  secp256k1_ge key_1;
  uchar pubkey_mods_zero [33];
  secp256k1_scalar ss;
  secp256k1_scalar sr;
  secp256k1_scalar msg;
  secp256k1_ge key;
  secp256k1_gej keyj;
  secp256k1_ecdsa_signature sig;
  int t;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffb288;
  secp256k1_context *in_stack_ffffffffffffb290;
  secp256k1_scalar *in_stack_ffffffffffffb298;
  secp256k1_scalar *in_stack_ffffffffffffb2a0;
  secp256k1_scalar *in_stack_ffffffffffffb2b8;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb2c0;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb2c8;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb2d0;
  undefined4 in_stack_ffffffffffffb2d8;
  int in_stack_ffffffffffffb2dc;
  uchar *in_stack_ffffffffffffb2e0;
  secp256k1_gej *in_stack_ffffffffffffb2e8;
  secp256k1_ge *in_stack_ffffffffffffb2f0;
  secp256k1_context *in_stack_ffffffffffffb2f8;
  secp256k1_nonce_function in_stack_ffffffffffffb300;
  uchar *in_stack_ffffffffffffb308;
  uchar *in_stack_ffffffffffffb310;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb318;
  secp256k1_context *in_stack_ffffffffffffb320;
  secp256k1_context *in_stack_ffffffffffffb328;
  secp256k1_pubkey *in_stack_ffffffffffffb350;
  uchar *in_stack_ffffffffffffb358;
  secp256k1_ecdsa_signature *in_stack_ffffffffffffb360;
  secp256k1_context *in_stack_ffffffffffffb368;
  secp256k1_scalar *in_stack_ffffffffffffb370;
  secp256k1_gej *in_stack_ffffffffffffb378;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffb380;
  uint in_stack_ffffffffffffb38c;
  void *in_stack_ffffffffffffb390;
  uchar *in_stack_ffffffffffffb398;
  uchar *in_stack_ffffffffffffb3a0;
  uchar *in_stack_ffffffffffffb3a8;
  uchar *in_stack_ffffffffffffb3b0;
  secp256k1_scalar *in_stack_ffffffffffffb460;
  secp256k1_ge *in_stack_ffffffffffffb468;
  secp256k1_scalar *in_stack_ffffffffffffb470;
  secp256k1_scalar *in_stack_ffffffffffffb478;
  undefined1 local_4a18 [32];
  undefined1 local_49f8 [32];
  undefined1 local_49d8 [32];
  undefined1 local_49b8 [32];
  undefined1 local_4998 [32];
  int local_4978;
  int local_4974;
  uchar *local_4970;
  secp256k1_scalar local_4968;
  secp256k1_scalar local_4948 [512];
  secp256k1_ecdsa_signature local_948;
  undefined1 local_908 [31];
  undefined1 local_8e9;
  undefined1 local_8e8 [31];
  undefined1 local_8c9;
  int local_8bc;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_880;
  undefined1 local_878 [76];
  int local_82c;
  undefined8 local_828;
  secp256k1_scalar local_7e0 [2];
  secp256k1_scalar local_7a0 [4];
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined8 local_700;
  undefined1 local_6f8 [48];
  secp256k1_scalar local_6c8 [2];
  secp256k1_scalar local_688 [7];
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined1 local_578 [48];
  undefined1 local_548 [48];
  secp256k1_scalar local_518;
  secp256k1_scalar local_4f8;
  secp256k1_scalar local_4d8 [7];
  undefined1 local_3e8 [48];
  undefined1 local_3b8 [32];
  undefined1 local_398;
  secp256k1_scalar local_390;
  secp256k1_scalar local_370;
  secp256k1_scalar local_350 [4];
  undefined1 local_2c8 [32];
  undefined1 local_2a8;
  secp256k1_scalar local_2a0;
  secp256k1_scalar local_280;
  secp256k1_scalar local_260 [4];
  undefined1 local_1d8 [48];
  secp256k1_scalar local_1a8;
  secp256k1_scalar local_188;
  uint64_t local_168;
  uint64_t local_160;
  uint64_t local_158;
  uint64_t local_150;
  undefined1 local_44 [64];
  int local_4;
  
  secp256k1_scalar_set_int(&local_1a8,1);
  secp256k1_scalar_negate(in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298);
  secp256k1_scalar_inverse((secp256k1_scalar *)in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
  secp256k1_scalar_set_int(&local_188,1);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffb380,in_stack_ffffffffffffb378,in_stack_ffffffffffffb370);
  secp256k1_ge_set_gej(in_stack_ffffffffffffb2f0,in_stack_ffffffffffffb2e8);
  local_168 = local_1a8.d[0];
  local_160 = local_1a8.d[1];
  local_158 = local_1a8.d[2];
  local_150 = local_1a8.d[3];
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c39,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  memcpy(local_1d8,&DAT_0016f410,0x21);
  secp256k1_scalar_set_int(&local_2a0,1);
  secp256k1_scalar_set_int(local_260,0);
  secp256k1_scalar_set_int(&local_280,0);
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c4b,
            "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33)");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c4c,"test condition failed: secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0")
    ;
    abort();
  }
  memset(local_2c8,0,0x21);
  local_2c8[0] = 2;
  local_2a8 = 1;
  secp256k1_scalar_set_int(&local_390,0);
  secp256k1_scalar_set_int(local_350,0);
  secp256k1_scalar_set_int(&local_370,1);
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c5e,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c5f,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  memset(local_3b8,0,0x21);
  local_3b8[0] = 2;
  local_398 = 2;
  memcpy(local_3e8,&DAT_0016f440,0x21);
  secp256k1_scalar_set_int(&local_518,2);
  secp256k1_scalar_set_int(local_4d8,0);
  secp256k1_scalar_set_int(&local_4f8,2);
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c79,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c7a,"test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c7b,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c7c,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c7e,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c7f,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_set_int(&local_518,1);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c81,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c82,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0")
    ;
    abort();
  }
  memcpy(local_548,&DAT_0016f470,0x21);
  memcpy(local_578,&DAT_0016f4a0,0x21);
  local_598 = 0;
  local_590 = 0x100000000000000;
  local_588 = 0xc45fb75019235145;
  local_580 = 0xebbac92f72a12d40;
  secp256k1_scalar_set_int(local_6c8,1);
  secp256k1_scalar_set_int(local_688,1);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffb2a0,(uchar *)in_stack_ffffffffffffb298,
             (int *)in_stack_ffffffffffffb290);
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca2,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca3,"test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca4,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca5,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca7,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ca8,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1")
    ;
    abort();
  }
  secp256k1_scalar_set_int(local_6c8,2);
  secp256k1_scalar_inverse_var
            ((secp256k1_scalar *)in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cab,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cac,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0")
    ;
    abort();
  }
  memcpy(local_6f8,&DAT_0016f4d0,0x21);
  local_718 = 0;
  local_710 = 0x100000000000000;
  local_708 = 0xc45fb75019235145;
  local_700 = 0xeebac92f72a12d40;
  secp256k1_scalar_set_int(local_7e0,1);
  secp256k1_scalar_set_int(local_7a0,1);
  secp256k1_scalar_negate(in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffb2a0,(uchar *)in_stack_ffffffffffffb298,
             (int *)in_stack_ffffffffffffb290);
  iVar1 = secp256k1_eckey_pubkey_parse
                    ((secp256k1_ge *)in_stack_ffffffffffffb328,(uchar *)in_stack_ffffffffffffb320,
                     (size_t)in_stack_ffffffffffffb318);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cc5,"test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cc6,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  secp256k1_scalar_negate(in_stack_ffffffffffffb2a0,in_stack_ffffffffffffb298);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cc8,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1");
    abort();
  }
  secp256k1_scalar_set_int(local_7e0,3);
  secp256k1_scalar_inverse_var
            ((secp256k1_scalar *)in_stack_ffffffffffffb2c0,in_stack_ffffffffffffb2b8);
  iVar1 = secp256k1_ecdsa_sig_verify
                    (in_stack_ffffffffffffb478,in_stack_ffffffffffffb470,in_stack_ffffffffffffb468,
                     in_stack_ffffffffffffb460);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ccb,"test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0");
    abort();
  }
  local_898 = 0;
  local_890 = 0;
  local_888 = 0;
  local_880 = 0x100000000000000;
  local_8b8 = 0x5344230681994186;
  local_8b0 = 0xf7f478316a9d5faa;
  local_8a8 = 0x62777a810be012b8;
  local_8a0 = 0xa9293eb931dddf65;
  local_82c = 0;
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb290,in_stack_ffffffffffffb288,(void *)0x151205);
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cee,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cef,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0"
           );
    abort();
  }
  local_8a0 = CONCAT17(0xaa,(undefined7)local_8a0);
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf1,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1"
           );
    abort();
  }
  if (local_82c != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf2,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf3,
            "test condition failed: secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2) == 0"
           );
    abort();
  }
  if (local_82c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf4,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf5,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2) == 0"
           );
    abort();
  }
  if (local_82c != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf6,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf7,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2) == 0"
           );
    abort();
  }
  if (local_82c != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf8,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ecdsa_sign
                    (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310,
                     in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cf9,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_ffffffffffffb328,(secp256k1_pubkey *)in_stack_ffffffffffffb320,
                     in_stack_ffffffffffffb318->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cfa,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb368,in_stack_ffffffffffffb360,in_stack_ffffffffffffb358,
                     in_stack_ffffffffffffb350);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cfb,"test condition failed: secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey) == 0");
    abort();
  }
  if (local_82c != 4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cfc,"test condition failed: ecount == 4");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb368,in_stack_ffffffffffffb360,in_stack_ffffffffffffb358,
                     in_stack_ffffffffffffb350);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cfd,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey) == 0");
    abort();
  }
  if (local_82c != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cfe,"test condition failed: ecount == 5");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb368,in_stack_ffffffffffffb360,in_stack_ffffffffffffb358,
                     in_stack_ffffffffffffb350);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1cff,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, NULL) == 0");
    abort();
  }
  if (local_82c != 6) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d00,"test condition failed: ecount == 6");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb368,in_stack_ffffffffffffb360,in_stack_ffffffffffffb358,
                     in_stack_ffffffffffffb350);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d01,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1");
    abort();
  }
  if (local_82c != 6) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d02,"test condition failed: ecount == 6");
    abort();
  }
  iVar1 = secp256k1_ec_pubkey_create
                    (in_stack_ffffffffffffb328,(secp256k1_pubkey *)in_stack_ffffffffffffb320,
                     in_stack_ffffffffffffb318->data);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d03,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, NULL) == 0");
    abort();
  }
  if (local_82c != 7) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d04,"test condition failed: ecount == 7");
    abort();
  }
  iVar1 = secp256k1_ecdsa_verify
                    (in_stack_ffffffffffffb368,in_stack_ffffffffffffb360,in_stack_ffffffffffffb358,
                     in_stack_ffffffffffffb350);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d06,"test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 0");
    abort();
  }
  if (local_82c != 8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d07,"test condition failed: ecount == 8");
    abort();
  }
  local_828 = 0x48;
  iVar1 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,(size_t *)in_stack_ffffffffffffb2c8,
                     in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d09,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig) == 0"
           );
    abort();
  }
  if (local_82c != 9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0a,"test condition failed: ecount == 9");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,(size_t *)in_stack_ffffffffffffb2c8,
                     in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0b,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig) == 0"
           );
    abort();
  }
  if (local_82c != 10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0c,"test condition failed: ecount == 10");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,(size_t *)in_stack_ffffffffffffb2c8,
                     in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0d,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL) == 0"
           );
    abort();
  }
  if (local_82c != 0xb) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0e,"test condition failed: ecount == 11");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,(size_t *)in_stack_ffffffffffffb2c8,
                     in_stack_ffffffffffffb2c0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d0f,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1"
           );
    abort();
  }
  if (local_82c != 0xb) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d10,"test condition failed: ecount == 11");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data,
                     (size_t)in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d11,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen) == 0"
           );
    abort();
  }
  if (local_82c != 0xc) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d12,"test condition failed: ecount == 12");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data,
                     (size_t)in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d13,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen) == 0"
           );
    abort();
  }
  if (local_82c != 0xd) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d14,"test condition failed: ecount == 13");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data,
                     (size_t)in_stack_ffffffffffffb2c0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d15,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1"
           );
    abort();
  }
  if (local_82c != 0xd) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d16,"test condition failed: ecount == 13");
    abort();
  }
  local_828 = 10;
  iVar1 = secp256k1_ecdsa_signature_serialize_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,(size_t *)in_stack_ffffffffffffb2c8,
                     in_stack_ffffffffffffb2c0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d19,
            "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0"
           );
    abort();
  }
  if (local_82c != 0xd) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d1a,"test condition failed: ecount == 13");
    abort();
  }
  local_82c = 0;
  iVar1 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d1c,
            "test condition failed: secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL) == 0");
    abort();
  }
  if (local_82c != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d1d,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,in_stack_ffffffffffffb2c8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d1e,
            "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig) == 0"
           );
    abort();
  }
  if (local_82c != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d1f,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,in_stack_ffffffffffffb2c8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d20,
            "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL) == 0"
           );
    abort();
  }
  if (local_82c != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d21,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0->data,in_stack_ffffffffffffb2c8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d22,
            "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1"
           );
    abort();
  }
  if (local_82c != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d23,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d24,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature) == 0"
           );
    abort();
  }
  if (local_82c != 4) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d25,"test condition failed: ecount == 4");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d26,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL) == 0");
    abort();
  }
  if (local_82c != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d27,"test condition failed: ecount == 5");
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d28,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1"
           );
    abort();
  }
  if (local_82c != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d29,"test condition failed: ecount == 5");
    abort();
  }
  memset(local_878,0xff,0x40);
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffb2dc,in_stack_ffffffffffffb2d8),
                     in_stack_ffffffffffffb2d0,in_stack_ffffffffffffb2c8->data);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d2b,
            "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0"
           );
    abort();
  }
  if (local_82c != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d2c,"test condition failed: ecount == 5");
    abort();
  }
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffb290,in_stack_ffffffffffffb288,(void *)0x152739);
  for (local_4 = 0; local_4 < 2; local_4 = local_4 + 1) {
    local_4970 = "";
    if (local_4 == 0) {
      local_4970 = (uchar *)0x0;
    }
    memset(local_908,0,0x20);
    local_8e9 = 1;
    memset(local_8e8,0xff,0x20);
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d3e,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0");
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x15282d);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d3f,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    memset(local_8e8,0,0x20);
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d42,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0");
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x152913);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d43,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    local_8c9 = 1;
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d46,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0"
             );
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x1529ef);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d47,"test condition failed: is_empty_signature(&sig)");
      abort();
    }
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d49,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1"
             );
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x152ac5);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d4a,"test condition failed: !is_empty_signature(&sig)");
      abort();
    }
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d4b,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1"
             );
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x152b9d);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d4c,"test condition failed: !is_empty_signature(&sig2)");
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_44,&local_948,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d4d,"test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0");
      abort();
    }
    iVar1 = secp256k1_ecdsa_sign
                      (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,in_stack_ffffffffffffb310
                       ,in_stack_ffffffffffffb308,in_stack_ffffffffffffb300,
                       in_stack_ffffffffffffb2f8);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d4f,
              "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1")
      ;
      abort();
    }
    iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x152cd8);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d50,"test condition failed: !is_empty_signature(&sig2)");
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_44,&local_948,0x40);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1d51,"test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0");
      abort();
    }
    for (local_8bc = 0; local_8bc < 0x100; local_8bc = local_8bc + 1) {
      local_908[0] = (undefined1)local_8bc;
      iVar1 = secp256k1_ecdsa_sign
                        (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,
                         in_stack_ffffffffffffb310,in_stack_ffffffffffffb308,
                         in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
      if (iVar1 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1d56,
                "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
               );
        abort();
      }
      iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x152e3b);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1d57,"test condition failed: !is_empty_signature(&sig2)");
        abort();
      }
      secp256k1_ecdsa_signature_load(CTX,local_4948 + local_8bc,&local_4968,&local_948);
      for (local_4974 = 0; local_4974 < local_8bc; local_4974 = local_4974 + 1) {
        iVar1 = secp256k1_scalar_eq(local_4948 + local_8bc,local_4948 + local_4974);
        if (iVar1 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0x1d5a,"test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])");
          abort();
        }
      }
    }
    local_908[0] = 0;
    local_8e9 = 2;
    for (local_8bc = 0x100; local_8bc < 0x200; local_8bc = local_8bc + 1) {
      local_8e8[0] = (undefined1)local_8bc;
      iVar1 = secp256k1_ecdsa_sign
                        (in_stack_ffffffffffffb320,in_stack_ffffffffffffb318,
                         in_stack_ffffffffffffb310,in_stack_ffffffffffffb308,
                         in_stack_ffffffffffffb300,in_stack_ffffffffffffb2f8);
      if (iVar1 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1d63,
                "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
               );
        abort();
      }
      iVar1 = is_empty_signature((secp256k1_ecdsa_signature *)0x153050);
      if (iVar1 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1d64,"test condition failed: !is_empty_signature(&sig2)");
        abort();
      }
      secp256k1_ecdsa_signature_load(CTX,local_4948 + local_8bc,&local_4968,&local_948);
      for (local_4978 = 0; local_4978 < local_8bc; local_4978 = local_4978 + 1) {
        iVar1 = secp256k1_scalar_eq(local_4948 + local_8bc,local_4948 + local_4978);
        if (iVar1 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0x1d67,"test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])");
          abort();
        }
      }
    }
    local_8e8[0] = 0;
  }
  memset(local_4998,0,0x20);
  iVar1 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
                     in_stack_ffffffffffffb398,in_stack_ffffffffffffb390,in_stack_ffffffffffffb38c);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d78,
            "test condition failed: nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1"
           );
    abort();
  }
  iVar1 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
                     in_stack_ffffffffffffb398,in_stack_ffffffffffffb390,in_stack_ffffffffffffb38c);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d7a,
            "test condition failed: nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1"
           );
    abort();
  }
  iVar1 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
                     in_stack_ffffffffffffb398,in_stack_ffffffffffffb390,in_stack_ffffffffffffb38c);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d7c,
            "test condition failed: nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1"
           );
    abort();
  }
  iVar1 = nonce_function_rfc6979
                    (in_stack_ffffffffffffb3b0,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
                     in_stack_ffffffffffffb398,in_stack_ffffffffffffb390,in_stack_ffffffffffffb38c);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d7e,
            "test condition failed: nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1"
           );
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49b8,local_49d8,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d80,"test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49b8,local_49f8,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d81,"test condition failed: secp256k1_memcmp_var(nonce, nonce3, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49b8,local_4a18,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d82,"test condition failed: secp256k1_memcmp_var(nonce, nonce4, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49d8,local_49f8,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d83,"test condition failed: secp256k1_memcmp_var(nonce2, nonce3, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49d8,local_4a18,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d84,"test condition failed: secp256k1_memcmp_var(nonce2, nonce4, 32) != 0");
    abort();
  }
  iVar1 = secp256k1_memcmp_var(local_49f8,local_4a18,0x20);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d85,"test condition failed: secp256k1_memcmp_var(nonce3, nonce4, 32) != 0");
    abort();
  }
  iVar1 = ec_privkey_export_der
                    (in_stack_ffffffffffffb2f8,(uchar *)in_stack_ffffffffffffb2f0,
                     (size_t *)in_stack_ffffffffffffb2e8,in_stack_ffffffffffffb2e0,
                     in_stack_ffffffffffffb2dc);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d93,
            "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0)");
    abort();
  }
  iVar1 = ec_privkey_export_der
                    (in_stack_ffffffffffffb2f8,(uchar *)in_stack_ffffffffffffb2f0,
                     (size_t *)in_stack_ffffffffffffb2e8,in_stack_ffffffffffffb2e0,
                     in_stack_ffffffffffffb2dc);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1d95,
            "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1)");
    abort();
  }
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        int32_t ecount;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        ecount = 0;
        secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK(ecount == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK(secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, NULL) == 0);
        CHECK(ecount == 6);
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK(ecount == 6);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, NULL) == 0);
        CHECK(ecount == 7);
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 0);
        CHECK(ecount == 8);
        siglen = 72;
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig) == 0);
        CHECK(ecount == 9);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig) == 0);
        CHECK(ecount == 10);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL) == 0);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK(ecount == 11);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen) == 0);
        CHECK(ecount == 12);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen) == 0);
        CHECK(ecount == 13);
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        CHECK(ecount == 13);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK(ecount == 13);
        ecount = 0;
        CHECK(secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL) == 0);
        CHECK(ecount == 1);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig) == 0);
        CHECK(ecount == 2);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL) == 0);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK(ecount == 3);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature) == 0);
        CHECK(ecount == 4);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL) == 0);
        CHECK(ecount == 5);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        CHECK(ecount == 5);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
        CHECK(ecount == 5);
        secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}